

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_info.cc
# Opt level: O1

void X509_INFO_free(X509_INFO *a)

{
  X509_PKEY *orig_ptr;
  
  if (a != (X509_INFO *)0x0) {
    X509_free(a->x509);
    X509_CRL_free(a->crl);
    orig_ptr = a->x_pkey;
    if (orig_ptr != (X509_PKEY *)0x0) {
      EVP_PKEY_free(*(EVP_PKEY **)orig_ptr);
      OPENSSL_free(orig_ptr);
    }
    OPENSSL_free(a->enc_data);
    OPENSSL_free(a);
    return;
  }
  return;
}

Assistant:

void X509_INFO_free(X509_INFO *x) {
  if (x == NULL) {
    return;
  }

  X509_free(x->x509);
  X509_CRL_free(x->crl);
  X509_PKEY_free(x->x_pkey);
  OPENSSL_free(x->enc_data);
  OPENSSL_free(x);
}